

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O1

GList * g_list_insert_sorted(GList *list,gpointer data,GCompareFunc compare)

{
  GList **ppGVar1;
  gint gVar2;
  GList *pGVar3;
  GList *pGVar4;
  
  pGVar3 = (GList *)g_malloc(0x18);
  pGVar3->data = data;
  pGVar4 = list;
  if (list == (GList *)0x0) {
    pGVar3->next = (GList *)0x0;
    pGVar3->prev = (GList *)0x0;
  }
  else {
    do {
      pGVar3->prev = pGVar4->prev;
      gVar2 = (*compare)(data,pGVar4->data);
      if (gVar2 < 1) {
        pGVar3->next = pGVar4;
        pGVar4->prev = pGVar3;
        if (pGVar4 == list) {
          return pGVar3;
        }
        return list;
      }
      ppGVar1 = &pGVar4->next;
      pGVar4 = *ppGVar1;
    } while (*ppGVar1 != (GList *)0x0);
    pGVar4 = pGVar3->prev->next;
    pGVar3->prev = pGVar4;
    pGVar3->next = (GList *)0x0;
    pGVar4->next = pGVar3;
    pGVar3 = list;
  }
  return pGVar3;
}

Assistant:

GList *g_list_insert_sorted(GList *list, gpointer data, GCompareFunc compare)
{
    GList *i;
    GList *n = (GList*)g_malloc(sizeof(GList));
    n->data = data;
    if (list == NULL) {
        n->next = n->prev = NULL;
        return n;
    }
    for (i = list; i; i = i->next) {
        n->prev = i->prev;
        if ((*compare)(data, i->data) <= 0) {
            n->next = i;
            i->prev = n;
            if (i == list) return n;
            else return list;
        }
    }
    n->prev = n->prev->next;
    n->next = NULL;
    n->prev->next = n;
    return list;
}